

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

void __thiscall Json::Value::CommentInfo::setComment(CommentInfo *this,char *text)

{
  runtime_error *this_00;
  char *pcVar1;
  char *in_RSI;
  long *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  if (*in_RDI != 0) {
    releaseStringValue((char *)0x1262cb);
  }
  if ((*in_RSI != '\0') && (*in_RSI != '/')) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"in Json::Value::setComment(): Comments must start with /");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pcVar1 = duplicateStringValue(in_RSI,in_stack_ffffffffffffffec);
  *in_RDI = (long)pcVar1;
  return;
}

Assistant:

void Value::CommentInfo::setComment(const char* text) {
  if (comment_)
    releaseStringValue(comment_);
  JSON_ASSERT(text != 0);
  JSON_ASSERT_MESSAGE(
      text[0] == '\0' || text[0] == '/',
      "in Json::Value::setComment(): Comments must start with /");
  // It seems that /**/ style comments are acceptable as well.
  comment_ = duplicateStringValue(text);
}